

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_filter_ws<false>(Parser *this,substr r,size_t *i,size_t *pos)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  code *pcVar4;
  Location LVar5;
  bool bVar6;
  ulong uVar7;
  ro_substr chars;
  char msg [44];
  basic_substring<char> local_90;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  char local_58 [48];
  
  local_90.len = r.len;
  local_90.str = r.str;
  uVar7 = *i;
  if (local_90.len <= uVar7) {
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    handle_error(0x250c0a,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14c3,"i >= 0 && i < len");
  }
  cVar1 = local_90.str[uVar7];
  if ((cVar1 != '\t') && (cVar1 != ' ')) {
    builtin_strncpy(local_58 + 0x20,"rr == \'\\t\')",0xc);
    builtin_strncpy(local_58 + 0x10,"urr == \' \' || cu",0x10);
    builtin_strncpy(local_58,"check failed: (c",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_80 = 0;
    uStack_78 = 0x7bf3;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7bf3) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x7bf3) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_58,0x2c,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  if (uVar7 == 0) {
    uVar7 = basic_substring<char>::first_not_of(&local_90,' ',0);
  }
  else {
    chars.len = 2;
    chars.str = " \t";
    uVar7 = basic_substring<char>::first_not_of(&local_90,chars,uVar7);
  }
  if (uVar7 == 0xffffffffffffffff) {
    *i = local_90.len;
  }
  else {
    if (local_90.len <= uVar7) {
      if ((s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      handle_error(0x250c0a,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x14c3,"i >= 0 && i < len");
    }
    if ((local_90.str[uVar7] == '\r') || (local_90.str[uVar7] == '\n')) {
      *i = uVar7 - 1;
    }
    else {
      pcVar2 = (this->m_filter_arena).str;
      sVar3 = *pos;
      *pos = sVar3 + 1;
      pcVar2[sVar3] = cVar1;
    }
  }
  return;
}

Assistant:

void Parser::_filter_ws(substr r, size_t *C4_RESTRICT i, size_t *C4_RESTRICT pos)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfws(fmt, ...) _c4dbgpf("filt_nl[{}]: " fmt, *i, __VA_ARGS__)
    #else
    #define _c4dbgfws(...)
    #endif

    const char curr = r[*i];
    _c4dbgfws("found whitespace '{}'", _c4prc(curr));
    _RYML_CB_ASSERT(m_stack.m_callbacks, curr == ' ' || curr == '\t');

    size_t first = *i > 0 ? r.first_not_of(" \t", *i) : r.first_not_of(' ', *i);
    if(first != npos)
    {
        if(r[first] == '\n' || r[first] == '\r') // skip trailing whitespace
        {
            _c4dbgfws("whitespace is trailing on line. firstnonws='{}'@{}", _c4prc(r[first]), first);
            *i = first - 1; // correct for the loop increment
        }
        else // a legit whitespace
        {
            m_filter_arena.str[(*pos)++] = curr;
            _c4dbgfws("legit whitespace. sofar=[{}]~~~{}~~~", *pos, m_filter_arena.first(*pos));
        }
    }
    else
    {
        _c4dbgfws("... everything else is trailing whitespace{}", "");
        if C4_IF_CONSTEXPR (keep_trailing_whitespace)
            for(size_t j = *i; j < r.len; ++j)
                m_filter_arena.str[(*pos)++] = r[j];
        *i = r.len;
    }

    #undef _c4dbgfws
}